

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_traits.h
# Opt level: O0

int32_t __thiscall
charls::default_traits<unsigned_short,_unsigned_short>::modulo_range
          (default_traits<unsigned_short,_unsigned_short> *this,int32_t error_value)

{
  bool bVar1;
  int32_t iVar2;
  int local_14;
  int32_t error_value_local;
  default_traits<unsigned_short,_unsigned_short> *this_local;
  
  iVar2 = error_value;
  if (error_value < 1) {
    iVar2 = -error_value;
  }
  if (this->range < iVar2) {
    __assert_fail("std::abs(error_value) <= range",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/test/../src/default_traits.h"
                  ,0x61,
                  "int32_t charls::default_traits<unsigned short, unsigned short>::modulo_range(int32_t) const [SampleType = unsigned short, PixelType = unsigned short]"
                 );
  }
  local_14 = error_value;
  if (error_value < 0) {
    local_14 = this->range + error_value;
  }
  if ((this->range + 1) / 2 <= local_14) {
    local_14 = local_14 - this->range;
  }
  bVar1 = false;
  if (-this->range / 2 <= local_14) {
    bVar1 = local_14 <= (this->range + 1) / 2 + -1;
  }
  if (!bVar1) {
    __assert_fail("-range / 2 <= error_value && error_value <= ((range + 1) / 2) - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cornerstonejs[P]charls/test/../src/default_traits.h"
                  ,0x6d,
                  "int32_t charls::default_traits<unsigned short, unsigned short>::modulo_range(int32_t) const [SampleType = unsigned short, PixelType = unsigned short]"
                 );
  }
  return local_14;
}

Assistant:

FORCE_INLINE int32_t modulo_range(int32_t error_value) const noexcept
    {
        ASSERT(std::abs(error_value) <= range);

        if (error_value < 0)
        {
            error_value += range;
        }

        if (error_value >= (range + 1) / 2)
        {
            error_value -= range;
        }

        ASSERT(-range / 2 <= error_value && error_value <= ((range + 1) / 2) - 1);
        return error_value;
    }